

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_HA_Unmarshal(TPMU_HA *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_HA *target_local;
  
  switch(selector) {
  case 4:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->sha1,buffer,size,0x14);
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 0xb:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->sha1,buffer,size,0x20);
    break;
  case 0xc:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->sha1,buffer,size,0x30);
    break;
  case 0xd:
    target_local._4_4_ = BYTE_Array_Unmarshal(target->sha1,buffer,size,0x40);
    break;
  case 0x10:
    target_local._4_4_ = 0;
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_HA_Unmarshal(TPMU_HA *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_SHA1
        case TPM_ALG_SHA1:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha1), buffer, size, (INT32)SHA1_DIGEST_SIZE);
#endif // ALG_SHA1
#if         ALG_SHA256
        case TPM_ALG_SHA256:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha256), buffer, size, (INT32)SHA256_DIGEST_SIZE);
#endif // ALG_SHA256
#if         ALG_SHA384
        case TPM_ALG_SHA384:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha384), buffer, size, (INT32)SHA384_DIGEST_SIZE);
#endif // ALG_SHA384
#if         ALG_SHA512
        case TPM_ALG_SHA512:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha512), buffer, size, (INT32)SHA512_DIGEST_SIZE);
#endif // ALG_SHA512
#if         ALG_SM3_256
        case TPM_ALG_SM3_256:
            return BYTE_Array_Unmarshal((BYTE *)(target->sm3_256), buffer, size, (INT32)SM3_256_DIGEST_SIZE);
#endif // ALG_SM3_256
        case TPM_ALG_NULL:
            return TPM_RC_SUCCESS;
    }
    return TPM_RC_SELECTOR;
}